

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

GeneratorTracker *
Catch::Generators::GeneratorTracker::acquire(TrackerContext *ctx,NameAndLocation *nameAndLocation)

{
  ITracker *pIVar1;
  undefined8 uVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  undefined4 extraout_var;
  int __oflag;
  char *pcVar6;
  char *__file;
  shared_ptr<Catch::Generators::GeneratorTracker> tracker;
  ITrackerPtr thisTracker;
  undefined1 auStack_58 [40];
  size_t local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  ITracker *local_20;
  
  pcVar6 = auStack_58;
  __file = auStack_58;
  auStack_58._16_8_ = (GeneratorTracker *)0x0;
  auStack_58._24_8_ = 0;
  pIVar1 = ctx->m_currentTracker;
  bVar3 = TestCaseTracking::operator==(&pIVar1->m_nameAndLocation,nameAndLocation);
  if (bVar3) {
    iVar5 = (*pIVar1->_vptr_ITracker[7])(pIVar1);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x60))
              (&local_30,(long *)CONCAT44(extraout_var,iVar5),nameAndLocation);
  }
  else {
    (*pIVar1->_vptr_ITracker[0xc])(&local_30,pIVar1,nameAndLocation);
    if (local_30 == 0) {
      local_20 = pIVar1;
      std::
      make_shared<Catch::Generators::GeneratorTracker,Catch::TestCaseTracking::NameAndLocation_const&,Catch::TestCaseTracking::TrackerContext&,Catch::TestCaseTracking::ITracker*>
                ((NameAndLocation *)auStack_58,(TrackerContext *)nameAndLocation,(ITracker **)ctx);
      clara::std::__shared_ptr<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2>::
      operator=((__shared_ptr<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2> *)
                (auStack_58 + 0x10),
                (__shared_ptr<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2> *)
                auStack_58);
      clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 8));
      std::__shared_ptr<Catch::TestCaseTracking::ITracker,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Catch::Generators::GeneratorTracker,void>
                ((__shared_ptr<Catch::TestCaseTracking::ITracker,(__gnu_cxx::_Lock_policy)2> *)
                 auStack_58,
                 (__shared_ptr<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2> *)
                 (auStack_58 + 0x10));
      (*pIVar1->_vptr_ITracker[0xb])(pIVar1);
      goto LAB_0013b072;
    }
  }
  std::static_pointer_cast<Catch::Generators::GeneratorTracker,Catch::TestCaseTracking::ITracker>
            ((shared_ptr<Catch::TestCaseTracking::ITracker> *)auStack_58);
  clara::std::__shared_ptr<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2>::
  operator=((__shared_ptr<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2> *)
            (auStack_58 + 0x10),
            (__shared_ptr<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2> *)
            auStack_58);
  __file = pcVar6;
LAB_0013b072:
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 8));
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  cVar4 = (**(code **)(*(long *)auStack_58._16_8_ + 0x10))();
  if (cVar4 == '\0') {
    TestCaseTracking::TrackerBase::open((TrackerBase *)auStack_58._16_8_,__file,__oflag);
  }
  uVar2 = auStack_58._16_8_;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 0x18));
  return (GeneratorTracker *)uVar2;
}

Assistant:

static GeneratorTracker& acquire( TrackerContext& ctx, TestCaseTracking::NameAndLocation const& nameAndLocation ) {
                std::shared_ptr<GeneratorTracker> tracker;

                ITracker& currentTracker = ctx.currentTracker();
                // Under specific circumstances, the generator we want
                // to acquire is also the current tracker. If this is
                // the case, we have to avoid looking through current
                // tracker's children, and instead return the current
                // tracker.
                // A case where this check is important is e.g.
                //     for (int i = 0; i < 5; ++i) {
                //         int n = GENERATE(1, 2);
                //     }
                //
                // without it, the code above creates 5 nested generators.
                if (currentTracker.nameAndLocation() == nameAndLocation) {
                    auto thisTracker = currentTracker.parent().findChild(nameAndLocation);
                    assert(thisTracker);
                    assert(thisTracker->isGeneratorTracker());
                    tracker = std::static_pointer_cast<GeneratorTracker>(thisTracker);
                } else if ( TestCaseTracking::ITrackerPtr childTracker = currentTracker.findChild( nameAndLocation ) ) {
                    assert( childTracker );
                    assert( childTracker->isGeneratorTracker() );
                    tracker = std::static_pointer_cast<GeneratorTracker>( childTracker );
                } else {
                    tracker = std::make_shared<GeneratorTracker>( nameAndLocation, ctx, &currentTracker );
                    currentTracker.addChild( tracker );
                }

                if( !tracker->isComplete() ) {
                    tracker->open();
                }

                return *tracker;
            }